

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O1

int lj_cf_os_tmpname(lua_State *L)

{
  int __fd;
  char buf [16];
  char local_18 [16];
  
  builtin_strncpy(local_18,"/tmp/lua_XXXXXX",0x10);
  __fd = mkstemp64(local_18);
  if (__fd != -1) {
    close(__fd);
    lua_pushstring(L,local_18);
    return 1;
  }
  lj_err_caller(L,LJ_ERR_OSUNIQF);
}

Assistant:

LJLIB_CF(os_tmpname)
{
#if LJ_TARGET_PS3 || LJ_TARGET_PS4 || LJ_TARGET_PSVITA
  lj_err_caller(L, LJ_ERR_OSUNIQF);
  return 0;
#else
#if LJ_TARGET_POSIX
  char buf[15+1];
  int fp;
  strcpy(buf, "/tmp/lua_XXXXXX");
  fp = mkstemp(buf);
  if (fp != -1)
    close(fp);
  else
    lj_err_caller(L, LJ_ERR_OSUNIQF);
#else
  char buf[L_tmpnam];
  if (tmpnam(buf) == NULL)
    lj_err_caller(L, LJ_ERR_OSUNIQF);
#endif
  lua_pushstring(L, buf);
  return 1;
#endif
}